

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_relax_snode.h
# Opt level: O3

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::relax_snode
          (SparseLUImpl<double,_int> *this,int n,IndexVector *et,int relax_columns,
          IndexVector *descendants,IndexVector *relax_end)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Index size;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  undefined8 local_48;
  int local_3c;
  
  local_48 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
  local_3c = -1;
  if ((long)local_48 < 0) {
LAB_0014e26d:
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)relax_end,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  uVar7 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar7 == local_48) {
    uVar6 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar6 = uVar7;
    }
    uVar6 = uVar6 & 0xfffffffffffffffc;
    if (3 < (long)uVar7) {
      lVar8 = 0;
      do {
        piVar3 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar8;
        *piVar3 = local_48._4_4_;
        piVar3[1] = local_48._4_4_;
        piVar3[2] = local_48._4_4_;
        piVar3[3] = local_48._4_4_;
        lVar8 = lVar8 + 4;
      } while (lVar8 < (long)uVar6);
    }
    if ((long)uVar6 < (long)uVar7) {
      piVar3 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      do {
        piVar3[uVar6] = local_3c;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    local_48 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
    local_3c = 0;
    if ((long)local_48 < 0) goto LAB_0014e26d;
    PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)descendants,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    uVar7 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    if (uVar7 == local_48) {
      uVar6 = uVar7 + 3;
      if (-1 < (long)uVar7) {
        uVar6 = uVar7;
      }
      uVar6 = uVar6 & 0xfffffffffffffffc;
      if (3 < (long)uVar7) {
        lVar8 = 0;
        do {
          piVar3 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data + lVar8;
          *piVar3 = local_48._4_4_;
          piVar3[1] = local_48._4_4_;
          piVar3[2] = local_48._4_4_;
          piVar3[3] = local_48._4_4_;
          lVar8 = lVar8 + 4;
        } while (lVar8 < (long)uVar6);
      }
      if ((long)uVar6 < (long)uVar7) {
        piVar3 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        do {
          piVar3[uVar6] = local_3c;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if (0 < n) {
        piVar3 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
        uVar7 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        piVar4 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar6 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                .m_rows;
        uVar9 = 0;
        if ((long)uVar7 < 1) {
          uVar7 = uVar9;
        }
        do {
          if (uVar7 == uVar9) goto LAB_0014e24e;
          iVar1 = piVar3[uVar9];
          uVar11 = (ulong)iVar1;
          if (iVar1 != n) {
            if ((((long)uVar6 <= (long)uVar9) || (iVar1 < 0)) || (uVar6 <= uVar11))
            goto LAB_0014e24e;
            piVar4[uVar11] = piVar4[uVar9] + piVar4[uVar11] + 1;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)n != uVar9);
        if (0 < n) {
          piVar3 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar7 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          ;
          piVar4 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          lVar8 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                  .m_rows;
          piVar5 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar6 = 0;
          do {
            uVar10 = (uint)uVar6;
            if (((int)uVar10 < 0) || (lVar12 = (long)(int)uVar10, (long)uVar7 <= lVar12)) {
LAB_0014e24e:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x18a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                           );
            }
            uVar2 = piVar3[lVar12];
            if (uVar2 != n) {
              do {
                uVar13 = uVar2;
                uVar10 = (uint)uVar6;
                if ((int)uVar13 < 0) goto LAB_0014e24e;
                uVar6 = (ulong)uVar13;
                uVar9 = (ulong)(int)uVar13;
                if ((descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows <= (long)uVar9) goto LAB_0014e24e;
                if (relax_columns <=
                    (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data[uVar9]) break;
                if (uVar7 <= uVar9) goto LAB_0014e24e;
                uVar2 = piVar3[uVar9];
                uVar10 = uVar13;
              } while (uVar2 != n);
            }
            if (lVar8 <= lVar12) goto LAB_0014e24e;
            piVar4[lVar12] = uVar10;
            uVar9 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows;
            uVar6 = (ulong)(uVar10 + 1);
            if ((long)uVar9 <= (long)uVar6) goto LAB_0014e24e;
            while (((int)uVar6 < n && (piVar5[uVar6] != 0))) {
              uVar6 = uVar6 + 1;
              if (uVar9 == uVar6) goto LAB_0014e24e;
            }
          } while ((int)uVar6 < n);
        }
      }
      return;
    }
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
               );
}

Assistant:

void SparseLUImpl<Scalar,Index>::relax_snode (const Index n, IndexVector& et, const Index relax_columns, IndexVector& descendants, IndexVector& relax_end)
{
  
  // compute the number of descendants of each node in the etree
  Index j, parent; 
  relax_end.setConstant(emptyIdxLU);
  descendants.setZero();
  for (j = 0; j < n; j++) 
  {
    parent = et(j);
    if (parent != n) // not the dummy root
      descendants(parent) += descendants(j) + 1;
  }
  // Identify the relaxed supernodes by postorder traversal of the etree
  Index snode_start; // beginning of a snode 
  for (j = 0; j < n; )
  {
    parent = et(j);
    snode_start = j; 
    while ( parent != n && descendants(parent) < relax_columns ) 
    {
      j = parent; 
      parent = et(j);
    }
    // Found a supernode in postordered etree, j is the last column 
    relax_end(snode_start) = j; // Record last column
    j++;
    // Search for a new leaf
    while (descendants(j) != 0 && j < n) j++;
  } // End postorder traversal of the etree
  
}